

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_alter_table.cpp
# Opt level: O1

unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true> __thiscall
duckdb::Transformer::TransformAlter(Transformer *this,PGAlterTableStmt *stmt)

{
  size_type *psVar1;
  PGAlterTableType PVar2;
  PGNode *pPVar3;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var4;
  undefined1 *puVar5;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> oVar6;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> oVar7;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> oVar8;
  undefined8 uVar9;
  bool bVar10;
  AlterStatement *this_00;
  pointer pAVar11;
  reference pvVar12;
  LogicalType *pLVar13;
  PGConstraint *this_01;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> this_02;
  InternalException *pIVar14;
  NotImplementedException *pNVar15;
  ParserException *pPVar16;
  long in_RDX;
  undefined8 *puVar17;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_03;
  optional_ptr<duckdb_libpgquery::PGNode,_true> this_04;
  ColumnDefinition *pCVar19;
  ColumnDefinition *pCVar20;
  long *plVar21;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> command;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> column_def;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> constraint_1;
  templated_unique_single_t *result;
  optional_ptr<duckdb_libpgquery::PGList,_true> column_name_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> constraint;
  ColumnDefinition column_entry;
  AlterEntryData data;
  QualifiedName qualified_name;
  optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true> local_2a8;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [24];
  anon_union_8_3_7edaf945_for_data local_270;
  LogicalType local_268;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_250;
  long local_248;
  undefined1 local_240 [8];
  undefined1 local_238 [32];
  LogicalType local_218 [2];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_1e0;
  Value local_1d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_198 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  AlterEntryData local_f8;
  QualifiedName local_90;
  
  local_288._16_8_ = this;
  local_250.ptr = (PGNode *)stmt;
  if (*(int *)(*(long *)(in_RDX + 0x10) + 4) != 1) {
    pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
    local_238._0_8_ = local_238 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Only one ALTER command per statement is supported","");
    ParserException::ParserException(pPVar16,(string *)local_238);
    __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = (AlterStatement *)operator_new(0x80);
  AlterStatement::AlterStatement(this_00);
  ((SQLStatement *)local_288._16_8_)->_vptr_SQLStatement = (_func_int **)this_00;
  TransformQualifiedName(&local_90,(Transformer *)local_250.ptr,*(PGRangeVar **)(in_RDX + 8));
  plVar21 = *(long **)(*(long *)(in_RDX + 0x10) + 8);
  if (plVar21 != (long *)0x0) {
    local_140 = a_Stack_198;
    local_248 = in_RDX;
    do {
      local_2a8.ptr = (PGAlterTableCmd *)*plVar21;
      local_160 = &local_150;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_90.catalog._M_dataplus._M_p,
                 local_90.catalog._M_dataplus._M_p + local_90.catalog._M_string_length);
      local_118 = &local_108;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_90.schema._M_dataplus._M_p,
                 local_90.schema._M_dataplus._M_p + local_90.schema._M_string_length);
      local_138 = &local_128;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_90.name._M_dataplus._M_p,
                 local_90.name._M_dataplus._M_p + local_90.name._M_string_length);
      local_f8.if_not_found = *(OnEntryNotFound *)(local_248 + 0x1c);
      local_f8.catalog._M_dataplus._M_p = (pointer)&local_f8.catalog.field_2;
      this_03 = &local_f8.schema.field_2;
      local_f8.name._M_dataplus._M_p = (pointer)&local_f8.name.field_2;
      if (local_160 == &local_150) {
        local_f8.catalog.field_2._8_8_ = local_150._8_8_;
      }
      else {
        local_f8.catalog._M_dataplus._M_p = (pointer)local_160;
      }
      local_f8.catalog.field_2._M_allocated_capacity._1_7_ = local_150._M_allocated_capacity._1_7_;
      local_f8.catalog.field_2._M_local_buf[0] = local_150._M_local_buf[0];
      if (local_118 == &local_108) {
        local_f8.schema.field_2._8_8_ = local_108._8_8_;
        local_f8.schema._M_dataplus._M_p = (pointer)this_03;
      }
      else {
        local_f8.schema._M_dataplus._M_p = (pointer)local_118;
      }
      local_f8.schema.field_2._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
      local_f8.schema.field_2._M_local_buf[0] = local_108._M_local_buf[0];
      if (local_138 == &local_128) {
        local_f8.name.field_2._8_8_ = local_128._8_8_;
      }
      else {
        local_f8.name._M_dataplus._M_p = (pointer)local_138;
      }
      local_f8.name.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
      local_f8.name.field_2._M_local_buf[0] = local_128._M_local_buf[0];
      local_f8.name._M_string_length = local_130;
      local_f8.schema._M_string_length = local_110;
      local_f8.catalog._M_string_length = local_158;
      local_108._M_local_buf[0] = '\0';
      local_110 = 0;
      local_128._M_local_buf[0] = '\0';
      local_130 = 0;
      local_150._M_local_buf[0] = '\0';
      local_158 = 0;
      local_160 = &local_150;
      local_138 = &local_128;
      local_118 = &local_108;
      optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
      PVar2 = (local_2a8.ptr)->subtype;
      if (0x18 < (int)PVar2) {
        if (PVar2 == PG_AT_AlterColumnType) {
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          local_270 = (anon_union_8_3_7edaf945_for_data)(local_2a8.ptr)->def;
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&local_270);
          TransformColumnDefinition
                    ((ColumnDefinition *)local_238,(Transformer *)local_250.ptr,
                     (PGColumnDef *)local_270.ptr_value);
          local_2a0.ptr = (PGColumnDef *)0x0;
          if (*(int *)(local_248 + 0x18) != 0x26) {
            pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
            local_298._0_8_ = local_298 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,"Alter column\'s type is only supported for tables","");
            ParserException::ParserException(pPVar16,(string *)local_298);
            __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ColumnDefinition::GetType((LogicalType *)local_298,(ColumnDefinition *)local_238);
          LogicalType::LogicalType(&local_268,UNKNOWN);
          bVar10 = LogicalType::operator==((LogicalType *)local_298,&local_268);
          if (bVar10) {
            optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&local_270);
            pPVar3 = *(PGNode **)((long)local_270.ptr_value + 0x28);
            LogicalType::~LogicalType(&local_268);
            LogicalType::~LogicalType((LogicalType *)local_298);
            if (pPVar3 == (PGNode *)0x0) {
              pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
              local_298._0_8_ = local_298 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,
                         "Omitting the type is only possible in combination with USING","");
              ParserException::ParserException(pPVar16,(string *)local_298);
              __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            LogicalType::~LogicalType(&local_268);
            LogicalType::~LogicalType((LogicalType *)local_298);
          }
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&local_270);
          if (*(PGNode **)((long)local_270.ptr_value + 0x28) == (PGNode *)0x0) {
            optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
            oVar7.ptr = local_2a8.ptr;
            this_01 = (PGConstraint *)operator_new(0x50);
            ::std::__cxx11::string::string
                      ((string *)local_298,(oVar7.ptr)->name,(allocator *)&local_268);
            ColumnRefExpression::ColumnRefExpression
                      ((ColumnRefExpression *)this_01,(string *)local_298);
            if ((ColumnDefinition *)local_298._0_8_ != (ColumnDefinition *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_);
            }
            pLVar13 = ColumnDefinition::Type((ColumnDefinition *)local_238);
            this_02.ptr = (PGColumnDef *)operator_new(0x60);
            LogicalType::LogicalType((LogicalType *)local_298,pLVar13);
            local_268._0_8_ = this_01;
            CastExpression::CastExpression
                      ((CastExpression *)this_02.ptr,(LogicalType *)local_298,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_268,false);
            if ((PGConstraint *)local_268._0_8_ != (PGConstraint *)0x0) {
              (**(code **)(*(long *)&((ParsedExpression *)local_268._0_8_)->super_BaseExpression + 8
                          ))();
            }
            local_268._0_8_ = (ColumnDefinition *)0x0;
            LogicalType::~LogicalType((LogicalType *)local_298);
            oVar6.ptr = local_2a0.ptr;
          }
          else {
            optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGColumnDef,_true> *)&local_270);
            TransformExpression((Transformer *)local_298,local_250);
            this_02.ptr = (PGColumnDef *)local_298._0_8_;
            oVar8.ptr = local_2a0.ptr;
            local_298._0_8_ = (ColumnDefinition *)0x0;
            local_2a0.ptr = this_02.ptr;
            oVar6.ptr = (PGColumnDef *)local_298._0_8_;
            if ((ColumnDefinition *)oVar8.ptr != (ColumnDefinition *)0x0) {
              (**(code **)(*(long *)oVar8.ptr + 8))();
              this_02.ptr = local_2a0.ptr;
              oVar6.ptr = (PGColumnDef *)local_298._0_8_;
            }
          }
          local_2a0.ptr = this_02.ptr;
          if ((ColumnDefinition *)oVar6.ptr != (ColumnDefinition *)0x0) {
            (**(_func_int **)((long)(((ColumnDefinition *)oVar6.ptr)->name)._M_dataplus._M_p + 8))()
            ;
          }
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          oVar7.ptr = local_2a8.ptr;
          pLVar13 = ColumnDefinition::Type((ColumnDefinition *)local_238);
          make_uniq<duckdb::ChangeColumnTypeInfo,duckdb::AlterEntryData,char*&,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((duckdb *)local_298,&local_f8,&(oVar7.ptr)->name,pLVar13,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_2a0);
          uVar9 = local_298._0_8_;
          local_298._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
          _Var18._M_head_impl =
               (pAVar11->info).
               super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
               super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
          (pAVar11->info).
          super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
          super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar9;
          if (_Var18._M_head_impl != (AlterInfo *)0x0) {
            (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
          }
          if ((ColumnDefinition *)local_298._0_8_ != (ColumnDefinition *)0x0) {
            (**(code **)(*(long *)local_298._0_8_ + 8))();
          }
          if ((ColumnDefinition *)local_2a0.ptr != (ColumnDefinition *)0x0) {
            (**(code **)(*(long *)local_2a0.ptr + 8))();
          }
          goto LAB_00ea62ab;
        }
        if (PVar2 == PG_AT_SetPartitionedBy) {
          local_238._0_8_ = (ColumnDefinition *)0x0;
          local_238._8_8_ = (_Hash_node_base *)0x0;
          local_238._16_8_ = 0;
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          if ((local_2a8.ptr)->def_list != (PGList *)0x0) {
            optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
            TransformExpressionList
                      ((Transformer *)local_250.ptr,(local_2a8.ptr)->def_list,
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)local_238);
          }
          make_uniq<duckdb::SetPartitionedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                    ((duckdb *)local_298,&local_f8,
                     (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)local_238);
          uVar9 = local_298._0_8_;
          local_298._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
          _Var18._M_head_impl =
               (pAVar11->info).
               super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
               super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
          (pAVar11->info).
          super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
          super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar9;
          if (_Var18._M_head_impl != (AlterInfo *)0x0) {
            (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
          }
          if ((ColumnDefinition *)local_298._0_8_ != (ColumnDefinition *)0x0) {
            (**(code **)(*(long *)local_298._0_8_ + 8))();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)local_238);
        }
        else {
          if (PVar2 != PG_AT_SetSortedBy) goto switchD_00ea5a8a_caseD_1;
          local_238._0_8_ = (ColumnDefinition *)0x0;
          local_238._8_8_ = (_Hash_node_base *)0x0;
          local_238._16_8_ = 0;
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          if ((local_2a8.ptr)->def_list != (PGList *)0x0) {
            optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
            TransformOrderBy((Transformer *)local_250.ptr,(local_2a8.ptr)->def_list,
                             (vector<duckdb::OrderByNode,_true> *)local_238);
          }
          make_uniq<duckdb::SetSortedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::OrderByNode,true>>
                    ((duckdb *)local_298,&local_f8,(vector<duckdb::OrderByNode,_true> *)local_238);
          uVar9 = local_298._0_8_;
          local_298._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
          _Var18._M_head_impl =
               (pAVar11->info).
               super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
               super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
          (pAVar11->info).
          super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
          super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar9;
          if (_Var18._M_head_impl != (AlterInfo *)0x0) {
            (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
          }
          if ((ColumnDefinition *)local_298._0_8_ != (ColumnDefinition *)0x0) {
            (**(code **)(*(long *)local_298._0_8_ + 8))();
          }
          ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
                    ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)local_238)
          ;
        }
        goto LAB_00ea6308;
      }
      switch(PVar2) {
      case PG_AT_AddColumn:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        local_270 = (local_2a8.ptr)->def_list->head->data;
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        local_2a0.ptr = (PGColumnDef *)((local_2a8.ptr)->def_list->tail->data).ptr_value;
        if (*(int *)(local_248 + 0x18) != 0x26) {
          pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Adding columns is only supported for tables","");
          ParserException::ParserException(pPVar16,(string *)local_238);
          __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a0);
        if ((local_2a0.ptr)->category == COL_GENERATED) {
          pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,
                     "Adding generated columns after table creation is not supported yet","");
          ParserException::ParserException(pPVar16,(string *)local_238);
          __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a0);
        this_04.ptr = (PGNode *)local_250;
        TransformColumnDefinition
                  ((ColumnDefinition *)local_238,(Transformer *)local_250.ptr,local_2a0.ptr);
        optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a0);
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)
            *(ParsedExpression **)
             &(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)&(local_2a0.ptr)->constraints)->
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            != (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
          optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::CheckValid(&local_2a0);
          for (puVar17 = *(undefined8 **)
                          ((long)(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)&(local_2a0.ptr)->constraints)->
                                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                 )._M_t.
                                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          + 8); puVar17 != (undefined8 *)0x0; puVar17 = (undefined8 *)puVar17[1]) {
            local_268._0_8_ = *puVar17;
            optional_ptr<duckdb_libpgquery::PGConstraint,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGConstraint,_true> *)&local_268);
            this_04.ptr = (PGNode *)local_250;
            TransformConstraint((Transformer *)local_240,(PGConstraint *)local_250.ptr,
                                (ColumnDefinition *)local_268._0_8_,(idx_t)local_238);
            if (local_240 != (undefined1  [8])0x0) {
              pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
              local_298._0_8_ = local_298 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,"Adding columns with constraints not yet supported","")
              ;
              ParserException::ParserException(pPVar16,(string *)local_298);
              __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
        optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&local_270);
        TransformNameList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_268,(Transformer *)this_04.ptr,(PGList *)local_270.ptr_value);
        if ((element_type *)local_268._0_8_ ==
            local_268.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          local_298._0_8_ = local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Expected a name","");
          InternalException::InternalException(pIVar14,(string *)local_298);
          __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)&local_268);
        ColumnDefinition::SetName((ColumnDefinition *)local_238,pvVar12);
        if ((long)local_268.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
            local_268._0_8_ == 0x20) {
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          make_uniq<duckdb::AddColumnInfo,duckdb::AlterEntryData,duckdb::ColumnDefinition,bool&>
                    ((duckdb *)local_298,&local_f8,(ColumnDefinition *)local_238,
                     &(local_2a8.ptr)->missing_ok);
          _Var18._M_head_impl = (AlterInfo *)local_298._0_8_;
          local_298._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
        }
        else {
          psVar1 = &(((ColumnDefinition *)
                     ((long)local_268.type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + -0xd8))->tags)._M_h._M_element_count;
          puVar5 = (undefined1 *)
                   (((ColumnDefinition *)
                    ((long)local_268.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + -0xd8))->tags)._M_h._M_element_count;
          pCVar19 = (ColumnDefinition *)
                    ((long)local_268.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + -0xd8);
          local_268.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)psVar1;
          if ((size_t *)puVar5 != &(pCVar19->tags)._M_h._M_rehash_policy._M_next_resize) {
            operator_delete(puVar5);
          }
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          make_uniq<duckdb::AddFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,duckdb::ColumnDefinition,bool&>
                    ((duckdb *)local_298,&local_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_268,(ColumnDefinition *)local_238,&(local_2a8.ptr)->missing_ok);
          _Var18._M_head_impl = (AlterInfo *)local_298._0_8_;
          local_298._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
        }
        _Var4._M_head_impl =
             (pAVar11->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar11->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>
        ._M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var18._M_head_impl;
        if (_Var4._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
        }
        if ((ColumnDefinition *)local_298._0_8_ != (ColumnDefinition *)0x0) {
          (**(code **)(*(long *)local_298._0_8_ + 8))();
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_268);
LAB_00ea62ab:
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_140);
        Value::~Value(&local_1d8);
        if (local_1e0._M_head_impl != (ParsedExpression *)0x0) {
          (*(code *)(((CommonTableExpressionMap *)
                     ((local_1e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->map).
                    map.
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)();
        }
        local_1e0._M_head_impl = (ParsedExpression *)0x0;
        LogicalType::~LogicalType(local_218);
        if ((ColumnDefinition *)local_238._0_8_ != (ColumnDefinition *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_);
        }
        break;
      default:
switchD_00ea5a8a_caseD_1:
        pNVar15 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_238._0_8_ = local_238 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"No support for that ALTER TABLE option yet!","");
        NotImplementedException::NotImplementedException(pNVar15,(string *)local_238);
        __cxa_throw(pNVar15,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      case PG_AT_ColumnDefault:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        TransformExpression((Transformer *)local_298,local_250);
        if (*(int *)(local_248 + 0x18) != 0x26) {
          pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Alter column\'s default is only supported for tables","");
          ParserException::ParserException(pPVar16,(string *)local_238);
          __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        make_uniq<duckdb::SetDefaultInfo,duckdb::AlterEntryData,char*&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((duckdb *)local_238,&local_f8,&(local_2a8.ptr)->name,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_298);
        uVar9 = local_238._0_8_;
        local_238._0_8_ = (ColumnDefinition *)0x0;
        pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                  ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                *)local_288._16_8_);
        _Var18._M_head_impl =
             (pAVar11->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar11->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>
        ._M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar9;
        pCVar19 = (ColumnDefinition *)local_238._0_8_;
        if (_Var18._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
          pCVar19 = (ColumnDefinition *)local_238._0_8_;
        }
        goto LAB_00ea5e95;
      case PG_AT_DropNotNull:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        make_uniq<duckdb::DropNotNullInfo,duckdb::AlterEntryData,char*&>
                  ((duckdb *)local_238,&local_f8,&(local_2a8.ptr)->name);
        _Var18._M_head_impl = (AlterInfo *)local_238._0_8_;
        local_238._0_8_ = (ColumnDefinition *)0x0;
        pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                  ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                *)local_288._16_8_);
        goto LAB_00ea5df7;
      case PG_AT_SetNotNull:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        make_uniq<duckdb::SetNotNullInfo,duckdb::AlterEntryData,char*&>
                  ((duckdb *)local_238,&local_f8,&(local_2a8.ptr)->name);
        _Var18._M_head_impl = (AlterInfo *)local_238._0_8_;
        local_238._0_8_ = (ColumnDefinition *)0x0;
        pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                  ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                *)local_288._16_8_);
LAB_00ea5df7:
        _Var4._M_head_impl =
             (pAVar11->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar11->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>
        ._M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var18._M_head_impl;
        pCVar20 = (ColumnDefinition *)local_238._0_8_;
        if (_Var4._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
          pCVar20 = (ColumnDefinition *)local_238._0_8_;
        }
        goto LAB_00ea5ea5;
      case PG_AT_DropColumn:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        local_268.id_ = (local_2a8.ptr)->behavior == PG_DROP_CASCADE;
        if (*(int *)(local_248 + 0x18) != 0x26) {
          pPVar16 = (ParserException *)__cxa_allocate_exception(0x10);
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Dropping columns is only supported for tables","");
          ParserException::ParserException(pPVar16,(string *)local_238);
          __cxa_throw(pPVar16,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        TransformNameList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_298,(Transformer *)this_03,(local_2a8.ptr)->def_list);
        if (local_298._0_8_ == local_298._8_8_) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Expected a name","");
          InternalException::InternalException(pIVar14,(string *)local_238);
          __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_298._8_8_ - local_298._0_8_ == 0x20) {
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_298,0);
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          make_uniq<duckdb::RemoveColumnInfo,duckdb::AlterEntryData,std::__cxx11::string&,bool&,bool&>
                    ((duckdb *)local_238,&local_f8,pvVar12,&(local_2a8.ptr)->missing_ok,
                     (bool *)&local_268);
          _Var18._M_head_impl = (AlterInfo *)local_238._0_8_;
          local_238._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
        }
        else {
          optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
          make_uniq<duckdb::RemoveFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,bool&,bool&>
                    ((duckdb *)local_238,&local_f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)local_298,&(local_2a8.ptr)->missing_ok,(bool *)&local_268);
          _Var18._M_head_impl = (AlterInfo *)local_238._0_8_;
          local_238._0_8_ = (ColumnDefinition *)0x0;
          pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                    ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                  *)local_288._16_8_);
        }
        _Var4._M_head_impl =
             (pAVar11->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar11->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>
        ._M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = _Var18._M_head_impl;
        if (_Var4._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
        }
        if ((ColumnDefinition *)local_238._0_8_ != (ColumnDefinition *)0x0) {
          (**(code **)(*(long *)local_238._0_8_ + 8))();
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_298);
        break;
      case PG_AT_AddConstraint:
        optional_ptr<duckdb_libpgquery::PGAlterTableCmd,_true>::CheckValid(&local_2a8);
        switchD_012dd528::default(local_238,(local_2a8.ptr)->def,0xa8);
        if (local_238._4_4_ != 5) {
          pNVar15 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_298._0_8_ = local_298 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"No support for that ALTER TABLE option yet!","");
          NotImplementedException::NotImplementedException(pNVar15,(string *)local_298);
          __cxa_throw(pNVar15,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        TransformConstraint((Transformer *)local_298,(PGConstraint *)local_250.ptr);
        make_uniq<duckdb::AddConstraintInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  ((duckdb *)&local_268,&local_f8,
                   (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_298);
        uVar9 = local_268._0_8_;
        local_268._0_8_ = (ColumnDefinition *)0x0;
        pAVar11 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                  ::operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                                *)local_288._16_8_);
        _Var18._M_head_impl =
             (pAVar11->info).
             super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
             super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
        (pAVar11->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>
        ._M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
        super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)uVar9;
        pCVar19 = (ColumnDefinition *)local_268._0_8_;
        if (_Var18._M_head_impl != (AlterInfo *)0x0) {
          (**(code **)(*(long *)&(_Var18._M_head_impl)->super_ParseInfo + 8))();
          pCVar19 = (ColumnDefinition *)local_268._0_8_;
        }
LAB_00ea5e95:
        pCVar20 = (ColumnDefinition *)local_298._0_8_;
        if (pCVar19 != (ColumnDefinition *)0x0) {
          (**(_func_int **)((long)(pCVar19->name)._M_dataplus._M_p + 8))();
          pCVar20 = (ColumnDefinition *)local_298._0_8_;
        }
LAB_00ea5ea5:
        if (pCVar20 != (ColumnDefinition *)0x0) {
          (**(_func_int **)((long)(pCVar20->name)._M_dataplus._M_p + 8))();
        }
      }
LAB_00ea6308:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
        operator_delete(local_f8.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.schema._M_dataplus._M_p != &local_f8.schema.field_2) {
        operator_delete(local_f8.schema._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.catalog._M_dataplus._M_p != &local_f8.catalog.field_2) {
        operator_delete(local_f8.catalog._M_dataplus._M_p);
      }
      plVar21 = (long *)plVar21[1];
    } while (plVar21 != (long *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
    operator_delete(local_90.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
    operator_delete(local_90.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)
         (_Tuple_impl<0UL,_duckdb::AlterStatement_*,_std::default_delete<duckdb::AlterStatement>_>)
         local_288._16_8_;
}

Assistant:

unique_ptr<AlterStatement> Transformer::TransformAlter(duckdb_libpgquery::PGAlterTableStmt &stmt) {

	D_ASSERT(stmt.relation);
	if (stmt.cmds->length != 1) {
		throw ParserException("Only one ALTER command per statement is supported");
	}

	auto result = make_uniq<AlterStatement>();
	auto qualified_name = TransformQualifiedName(*stmt.relation);

	// Check the ALTER type.
	for (auto c = stmt.cmds->head; c != nullptr; c = c->next) {

		auto command = PGPointerCast<duckdb_libpgquery::PGAlterTableCmd>(c->data.ptr_value);
		AlterEntryData data(qualified_name.catalog, qualified_name.schema, qualified_name.name,
		                    TransformOnEntryNotFound(stmt.missing_ok));

		switch (command->subtype) {
		case duckdb_libpgquery::PG_AT_AddColumn: {
			auto column_name_list = PGPointerCast<duckdb_libpgquery::PGList>(command->def_list->head->data.ptr_value);
			auto column_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(command->def_list->tail->data.ptr_value);
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Adding columns is only supported for tables");
			}
			if (column_def->category == duckdb_libpgquery::COL_GENERATED) {
				throw ParserException("Adding generated columns after table creation is not supported yet");
			}
			auto column_entry = TransformColumnDefinition(*column_def);
			if (column_def->constraints) {
				for (auto cell = column_def->constraints->head; cell != nullptr; cell = cell->next) {
					auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(cell->data.ptr_value);
					auto constraint = TransformConstraint(*pg_constraint, column_entry, 0);
					if (!constraint) {
						continue;
					}
					throw ParserException("Adding columns with constraints not yet supported");
				}
			}
			auto column_names = TransformNameList(*column_name_list);
			if (column_names.empty()) {
				throw InternalException("Expected a name");
			}
			column_entry.SetName(column_names.back());
			if (column_names.size() == 1) {
				// ADD COLUMN
				result->info = make_uniq<AddColumnInfo>(std::move(data), std::move(column_entry), command->missing_ok);
			} else {
				// ADD FIELD
				column_names.pop_back();
				result->info = make_uniq<AddFieldInfo>(std::move(data), std::move(column_names),
				                                       std::move(column_entry), command->missing_ok);
			}
			break;
		}
		case duckdb_libpgquery::PG_AT_DropColumn: {
			auto cascade = command->behavior == duckdb_libpgquery::PG_DROP_CASCADE;
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Dropping columns is only supported for tables");
			}
			auto column_names = TransformNameList(*command->def_list);
			if (column_names.empty()) {
				throw InternalException("Expected a name");
			}
			if (column_names.size() == 1) {
				result->info =
				    make_uniq<RemoveColumnInfo>(std::move(data), column_names[0], command->missing_ok, cascade);
			} else {
				result->info =
				    make_uniq<RemoveFieldInfo>(std::move(data), std::move(column_names), command->missing_ok, cascade);
			}
			break;
		}
		case duckdb_libpgquery::PG_AT_ColumnDefault: {
			auto expr = TransformExpression(command->def);
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Alter column's default is only supported for tables");
			}
			result->info = make_uniq<SetDefaultInfo>(std::move(data), command->name, std::move(expr));
			break;
		}
		case duckdb_libpgquery::PG_AT_AlterColumnType: {
			auto column_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(command->def);
			auto column_entry = TransformColumnDefinition(*column_def);

			unique_ptr<ParsedExpression> expr;
			if (stmt.relkind != duckdb_libpgquery::PG_OBJECT_TABLE) {
				throw ParserException("Alter column's type is only supported for tables");
			}

			if (column_entry.GetType() == LogicalType::UNKNOWN && !column_def->raw_default) {
				throw ParserException("Omitting the type is only possible in combination with USING");
			}

			if (column_def->raw_default) {
				expr = TransformExpression(column_def->raw_default);
			} else {
				auto col_ref = make_uniq<ColumnRefExpression>(command->name);
				expr = make_uniq<CastExpression>(column_entry.Type(), std::move(col_ref));
			}
			result->info =
			    make_uniq<ChangeColumnTypeInfo>(std::move(data), command->name, column_entry.Type(), std::move(expr));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetNotNull: {
			result->info = make_uniq<SetNotNullInfo>(std::move(data), command->name);
			break;
		}
		case duckdb_libpgquery::PG_AT_DropNotNull: {
			result->info = make_uniq<DropNotNullInfo>(std::move(data), command->name);
			break;
		}
		case duckdb_libpgquery::PG_AT_AddConstraint: {
			auto pg_constraint = PGCast<duckdb_libpgquery::PGConstraint>(*command->def);
			if (pg_constraint.contype != duckdb_libpgquery::PGConstrType::PG_CONSTR_PRIMARY) {
				throw NotImplementedException("No support for that ALTER TABLE option yet!");
			}

			auto constraint = TransformConstraint(pg_constraint);
			result->info = make_uniq<AddConstraintInfo>(std::move(data), std::move(constraint));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetPartitionedBy: {
			vector<unique_ptr<ParsedExpression>> partition_keys;
			if (command->def_list) {
				TransformExpressionList(*command->def_list, partition_keys);
			}
			result->info = make_uniq<SetPartitionedByInfo>(std::move(data), std::move(partition_keys));
			break;
		}
		case duckdb_libpgquery::PG_AT_SetSortedBy: {
			vector<OrderByNode> orders;
			if (command->def_list) {
				TransformOrderBy(command->def_list, orders);
			}
			result->info = make_uniq<SetSortedByInfo>(std::move(data), std::move(orders));
			break;
		}
		default:
			throw NotImplementedException("No support for that ALTER TABLE option yet!");
		}
	}
	return result;
}